

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::DisconnectNodes(CConnman *this)

{
  size_t *psVar1;
  uint *puVar2;
  pointer ppCVar3;
  CNode *pCVar4;
  CSemaphore *this_00;
  pointer pcVar5;
  _List_node_base *p_Var6;
  bool bVar7;
  int iVar8;
  Network NVar9;
  Logger *pLVar10;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> _Var11;
  _List_node_base *p_Var12;
  pointer ppCVar13;
  _Node *__tmp;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes_copy;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> reconnections_to_add
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  list<CNode_*,_std::allocator<CNode_*>_> nodes_disconnected_copy;
  _Alloc_hider local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  ConnectionType local_40;
  bool local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock63.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  reconnections_to_add.
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&reconnections_to_add;
  reconnections_to_add.
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node._M_size = 0;
  criticalblock63.super_unique_lock._M_owns = false;
  reconnections_to_add.
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       reconnections_to_add.
       super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock63.super_unique_lock);
  if (((this->fNetworkActive)._M_base._M_i & 1U) == 0) {
    ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar13 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppCVar13 != ppCVar3; ppCVar13 = ppCVar13 + 1)
    {
      pCVar4 = *ppCVar13;
      if (((pCVar4->fDisconnect)._M_base._M_i & 1U) == 0) {
        pLVar10 = LogInstance();
        bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
        if (bVar7) {
          nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)pCVar4->id;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file._M_len = 0x57;
          logging_function._M_str = "DisconnectNodes";
          logging_function._M_len = 0xf;
          LogPrintFormatInternal<long>
                    (logging_function,source_file,0x755,NET,Debug,
                     (ConstevalFormatString<1U>)0xf798d8,(long *)&nodes_disconnected_copy);
        }
        LOCK();
        (pCVar4->fDisconnect)._M_base._M_i = true;
        UNLOCK();
      }
    }
  }
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector(&nodes_copy,&this->m_nodes);
  if (nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppCVar13 = nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pnode = *ppCVar13;
      if (((pnode->fDisconnect)._M_base._M_i & 1U) != 0) {
        _Var11 = std::
                 __remove_if<__gnu_cxx::__normal_iterator<CNode**,std::vector<CNode*,std::allocator<CNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<CNode*const>>
                           ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             )(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             )(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish,&pnode);
        if (_Var11._M_current !=
            (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish = _Var11._M_current;
        }
        iVar8 = (*((pnode->m_transport)._M_t.
                   super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
                   super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
                   super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[10])();
        if ((char)iVar8 != '\0') {
          prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&nodes_disconnected_copy,
                     (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pnode->addr);
          this_00 = (pnode->grantOutbound).sem;
          bVar7 = (pnode->grantOutbound).fHaveGrant;
          (pnode->grantOutbound).fHaveGrant = false;
          (pnode->grantOutbound).sem = (CSemaphore *)0x0;
          local_60._M_p = (pointer)&local_50;
          pcVar5 = (pnode->m_dest)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,pcVar5,pcVar5 + (pnode->m_dest)._M_string_length);
          local_40 = pnode->m_conn_type;
          local_3c = false;
          std::__cxx11::
          list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
          _M_insert<CConnman::ReconnectionInfo>
                    (&reconnections_to_add,(iterator)&reconnections_to_add,
                     (ReconnectionInfo *)&nodes_disconnected_copy);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_p != &local_50) {
            operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
          }
          if (bVar7 == true) {
            CSemaphore::post(this_00);
          }
          if (0x10 < (uint)nodes_disconnected_copy.
                           super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
                           _M_size) {
            free(nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl
                 ._M_node.super__List_node_base._M_next);
          }
          pLVar10 = LogInstance();
          bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
          if (bVar7) {
            nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)pnode->id;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_00._M_len = 0x57;
            logging_function_00._M_str = "DisconnectNodes";
            logging_function_00._M_len = 0xf;
            LogPrintFormatInternal<long>
                      (logging_function_00,source_file_00,0x76e,NET,Debug,
                       (ConstevalFormatString<1U>)0xf798fe,(long *)&nodes_disconnected_copy);
          }
        }
        pCVar4 = pnode;
        if ((pnode->grantOutbound).fHaveGrant == true) {
          CSemaphore::post((pnode->grantOutbound).sem);
          (pCVar4->grantOutbound).fHaveGrant = false;
        }
        CNode::CloseSocketDisconnect(pnode);
        if (ADDR_FETCH < pnode->m_conn_type) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                        ,0x319,"bool CNode::IsManualOrFullOutboundConn() const");
        }
        if ((0x39U >> (pnode->m_conn_type & 0x1f) & 1) == 0) {
          NVar9 = CNetAddr::GetNetwork((CNetAddr *)&pnode->addr);
          puVar2 = (this->m_network_conn_counts)._M_elems + NVar9;
          *puVar2 = *puVar2 - 1;
        }
        LOCK();
        (pnode->nRefCount).super___atomic_base<int>._M_i =
             (pnode->nRefCount).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        p_Var12 = (_List_node_base *)operator_new(0x18);
        p_Var12[1]._M_next = (_List_node_base *)pnode;
        std::__detail::_List_node_base::_M_hook(p_Var12);
        psVar1 = &(this->m_nodes_disconnected).super__List_base<CNode_*,_std::allocator<CNode_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      ppCVar13 = ppCVar13 + 1;
    } while (ppCVar13 !=
             nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock63.super_unique_lock);
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::list
            (&nodes_disconnected_copy,&this->m_nodes_disconnected);
  if (nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&nodes_disconnected_copy) {
    p_Var12 = nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    do {
      nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Var12[1]._M_next;
      if (*(int *)&((_List_node_base *)
                   ((long)nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x230))->_M_next < 0) {
        __assert_fail("nRefCount >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                      ,0x385,"int CNode::GetRefCount() const");
      }
      if (*(int *)&((_List_node_base *)
                   ((long)nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x230))->_M_next < 1) {
        std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::remove
                  (&this->m_nodes_disconnected,(char *)&nodes_copy);
        DeleteNode(this,(CNode *)nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var12 = (((_List_base<CNode_*,_std::allocator<CNode_*>_> *)&p_Var12->_M_next)->_M_impl).
                _M_node.super__List_node_base._M_next;
    } while (p_Var12 != (_List_node_base *)&nodes_disconnected_copy);
  }
  p_Var12 = nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  while (p_Var12 != (_List_node_base *)&nodes_disconnected_copy) {
    p_Var6 = (((_List_base<CNode_*,_std::allocator<CNode_*>_> *)&p_Var12->_M_next)->_M_impl)._M_node
             .super__List_node_base._M_next;
    operator_delete(p_Var12,0x18);
    p_Var12 = p_Var6;
  }
  nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev._0_1_ = 0;
  nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_reconnections_mutex;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&nodes_disconnected_copy);
  if (reconnections_to_add.
      super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&reconnections_to_add) {
    std::__detail::_List_node_base::_M_transfer
              ((_List_node_base *)&this->m_reconnections,
               reconnections_to_add.
               super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
               ._M_impl._M_node.super__List_node_base._M_next);
    psVar1 = &(this->m_reconnections).
              super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + reconnections_to_add.
                        super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
                        ._M_impl._M_node._M_size;
    reconnections_to_add.
    super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
    _M_impl._M_node._M_size = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nodes_disconnected_copy);
  std::__cxx11::_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
  ::_M_clear(&reconnections_to_add.
              super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::DisconnectNodes()
{
    AssertLockNotHeld(m_nodes_mutex);
    AssertLockNotHeld(m_reconnections_mutex);

    // Use a temporary variable to accumulate desired reconnections, so we don't need
    // m_reconnections_mutex while holding m_nodes_mutex.
    decltype(m_reconnections) reconnections_to_add;

    {
        LOCK(m_nodes_mutex);

        if (!fNetworkActive) {
            // Disconnect any connected nodes
            for (CNode* pnode : m_nodes) {
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "Network not active, dropping peer=%d\n", pnode->GetId());
                    pnode->fDisconnect = true;
                }
            }
        }

        // Disconnect unused nodes
        std::vector<CNode*> nodes_copy = m_nodes;
        for (CNode* pnode : nodes_copy)
        {
            if (pnode->fDisconnect)
            {
                // remove from m_nodes
                m_nodes.erase(remove(m_nodes.begin(), m_nodes.end(), pnode), m_nodes.end());

                // Add to reconnection list if appropriate. We don't reconnect right here, because
                // the creation of a connection is a blocking operation (up to several seconds),
                // and we don't want to hold up the socket handler thread for that long.
                if (pnode->m_transport->ShouldReconnectV1()) {
                    reconnections_to_add.push_back({
                        .addr_connect = pnode->addr,
                        .grant = std::move(pnode->grantOutbound),
                        .destination = pnode->m_dest,
                        .conn_type = pnode->m_conn_type,
                        .use_v2transport = false});
                    LogDebug(BCLog::NET, "retrying with v1 transport protocol for peer=%d\n", pnode->GetId());
                }

                // release outbound grant (if any)
                pnode->grantOutbound.Release();

                // close socket and cleanup
                pnode->CloseSocketDisconnect();

                // update connection count by network
                if (pnode->IsManualOrFullOutboundConn()) --m_network_conn_counts[pnode->addr.GetNetwork()];

                // hold in disconnected pool until all refs are released
                pnode->Release();
                m_nodes_disconnected.push_back(pnode);
            }
        }
    }
    {
        // Delete disconnected nodes
        std::list<CNode*> nodes_disconnected_copy = m_nodes_disconnected;
        for (CNode* pnode : nodes_disconnected_copy)
        {
            // Destroy the object only after other threads have stopped using it.
            if (pnode->GetRefCount() <= 0) {
                m_nodes_disconnected.remove(pnode);
                DeleteNode(pnode);
            }
        }
    }
    {
        // Move entries from reconnections_to_add to m_reconnections.
        LOCK(m_reconnections_mutex);
        m_reconnections.splice(m_reconnections.end(), std::move(reconnections_to_add));
    }
}